

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::analyse_unary_expression(Analyser *this)

{
  bool bVar1;
  TokenType TVar2;
  Error *pEVar3;
  Token *pTVar4;
  Instruction local_214;
  undefined1 local_202;
  allocator<char> local_201;
  string local_200;
  Instruction local_1dc;
  Instruction local_1cc;
  undefined1 local_1ba;
  allocator<char> local_1b9;
  string local_1b8;
  undefined1 local_198 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_162;
  allocator<char> local_161;
  string local_160;
  optional<Token> local_140;
  char local_111;
  undefined1 local_110 [7];
  char type;
  string identifier;
  int32_t index;
  optional<Token> local_c8;
  optional<Token> local_a0;
  int local_74;
  undefined1 local_6d;
  int32_t factor;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  optional<Token> next;
  Analyser *this_local;
  
  next.super__Optional_base<Token,_false,_false>._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._32_8_ =
       this;
  nextToken((optional<Token> *)local_38,this);
  bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
  if (!bVar1) {
    local_6d = 1;
    pEVar3 = (Error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Missing <expression>",&local_59);
    Error::Error(pEVar3,&local_58,(long)this->_currentLine);
    local_6d = 0;
    __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
  }
  local_74 = 1;
  pTVar4 = std::optional<Token>::value((optional<Token> *)local_38);
  TVar2 = Token::GetType(pTVar4);
  if (TVar2 == PLUS_SIGN) {
    nextToken(&local_a0,this);
    std::optional<Token>::operator=((optional<Token> *)local_38,&local_a0);
    std::optional<Token>::~optional(&local_a0);
  }
  else {
    pTVar4 = std::optional<Token>::value((optional<Token> *)local_38);
    TVar2 = Token::GetType(pTVar4);
    if (TVar2 == MINUS_SIGN) {
      local_74 = -1;
      nextToken(&local_c8,this);
      std::optional<Token>::operator=((optional<Token> *)local_38,&local_c8);
      std::optional<Token>::~optional(&local_c8);
    }
  }
  bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
  if (!bVar1) {
    identifier.field_2._M_local_buf[0xe] = '\x01';
    pEVar3 = (Error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&index,"Missing <primary-expression>",
               (allocator<char> *)(identifier.field_2._M_local_buf + 0xf));
    Error::Error(pEVar3,(string *)&index,(long)this->_currentLine);
    identifier.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
  }
  std::__cxx11::string::string((string *)local_110);
  pTVar4 = std::optional<Token>::value((optional<Token> *)local_38);
  TVar2 = Token::GetType(pTVar4);
  if (TVar2 == UNSIGNED_INTEGER) {
    pTVar4 = std::optional<Token>::value((optional<Token> *)local_38);
    identifier.field_2._8_4_ = addConstant(this,pTVar4);
    Instruction::Instruction(&local_1dc,loadc,identifier.field_2._8_4_);
    addInstruction(this,&local_1dc);
  }
  else {
    if (TVar2 != IDENTIFIER) {
      if (TVar2 != LEFT_BRACKET) {
        local_202 = 1;
        pEVar3 = (Error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,"Missing <primary-expression>",&local_201);
        Error::Error(pEVar3,&local_200,(long)this->_currentLine);
        local_202 = 0;
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      analyse_expression(this);
      nextToken(&local_140,this);
      std::optional<Token>::operator=((optional<Token> *)local_38,&local_140);
      std::optional<Token>::~optional(&local_140);
      bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
      if (bVar1) {
        pTVar4 = std::optional<Token>::value((optional<Token> *)local_38);
        TVar2 = Token::GetType(pTVar4);
        if (TVar2 == RIGHT_BRACKET) goto LAB_00129661;
      }
      local_162 = 1;
      pEVar3 = (Error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"Missing \')\'",&local_161);
      Error::Error(pEVar3,&local_160,(long)this->_currentLine);
      local_162 = 0;
      __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
    }
    std::optional<Token>::value((optional<Token> *)local_38);
    Token::GetValue((Token *)local_198);
    std::any_cast<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_198 + 0x10),(any *)local_198);
    std::__cxx11::string::operator=((string *)local_110,(string *)(local_198 + 0x10));
    std::__cxx11::string::~string((string *)(local_198 + 0x10));
    std::any::~any((any *)local_198);
    bVar1 = loadVariable(this,(string *)local_110);
    if (bVar1) {
      Instruction::Instruction(&local_1cc,iload);
      addInstruction(this,&local_1cc);
    }
    else {
      local_111 = getFunctionRetType(this,(string *)local_110);
      if (local_111 == 'v') {
        local_1ba = 1;
        pEVar3 = (Error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"Can not call void function in < expression >",&local_1b9);
        Error::Error(pEVar3,&local_1b8,(long)this->_currentLine);
        local_1ba = 0;
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      unreadToken(this);
      analyse_function_call(this);
    }
  }
LAB_00129661:
  if (local_74 == -1) {
    Instruction::Instruction(&local_214,ineg);
    addInstruction(this,&local_214);
  }
  std::__cxx11::string::~string((string *)local_110);
  std::optional<Token>::~optional((optional<Token> *)local_38);
  return;
}

Assistant:

void Analyser::analyse_unary_expression() {
	auto next = nextToken();
	if (!next.has_value()) {
		throw Error("Missing <expression>", _currentLine);
	}
	//<unary - operator>
	std::int32_t factor = 1;
	if (next.value().GetType() == TokenType::PLUS_SIGN) {
		next = nextToken();
	}
	else if (next.value().GetType() == TokenType::MINUS_SIGN) {
		factor = -1;
		next = nextToken();
	}
	//primary - expression
	if (!next.has_value()) {
		throw Error("Missing <primary-expression>", _currentLine);
	}
	std::int32_t index;
	std::string identifier;
	char type;
	switch (next.value().GetType())
	{
	case TokenType::LEFT_BRACKET:
		analyse_expression();
		next = nextToken();
		if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
			throw Error("Missing ')'", _currentLine);
		}
		break;
	case TokenType::IDENTIFIER:
		identifier = std::any_cast<std::string>(next.value().GetValue());
		if (!loadVariable(identifier)) {
			type = getFunctionRetType(identifier);
			if (type == 'v') {
				throw Error("Can not call void function in < expression >", _currentLine);
			}
			unreadToken();
			analyse_function_call();
		}
		else {
			addInstruction(Instruction(Operation::iload));
		}
		break;
	case TokenType::UNSIGNED_INTEGER:
		index = addConstant(next.value());
		addInstruction(Instruction(Operation::loadc, index));
		break;
	default:
		throw Error("Missing <primary-expression>", _currentLine);
		break;
	}
	if (factor == -1) {
		addInstruction(Instruction(Operation::ineg));
	}
}